

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

bool __thiscall
libtorrent::session_handle::sync_call_ret<bool,bool(libtorrent::aux::session_impl::*)()const>
          (session_handle *this,offset_in_session_impl_to_subr f)

{
  io_context *ctx;
  undefined8 uVar1;
  bool r;
  bool done;
  exception_ptr ex;
  shared_ptr<libtorrent::aux::session_impl> s;
  bool local_7a;
  bool local_79;
  exception_ptr local_78;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_70;
  exception_ptr local_60;
  type_conflict3 local_58;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,this);
  if (local_70._M_ptr == (session_impl *)0x0) {
    local_58.r = (bool *)CONCAT44(local_58.r._4_4_,0x73);
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)&local_58);
  }
  local_58.ex = &local_78;
  local_78._M_exception_object = (void *)0x0;
  local_58.done = &local_79;
  local_79 = false;
  ctx = (local_70._M_ptr)->m_io_context;
  local_58.r = &local_7a;
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58.s.
              super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>,
             &local_70);
  local_58.f = f;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call_ret<bool,bool(libtorrent::aux::session_impl::*)()const>(bool(libtorrent::aux::session_impl::*)()const)const::_lambda()_1_>
            (ctx,&local_58,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.s.
              super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  aux::torrent_wait(&local_79,local_70._M_ptr);
  if (local_78._M_exception_object == (void *)0x0) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    return local_7a;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_60,&local_78);
  uVar1 = ::std::rethrow_exception((exception_ptr)&local_60);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_60);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  _Unwind_Resume(uVar1);
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}